

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

void set_statvfs_transfer_size(filesystem *fs,statvfs *sfs)

{
  unsigned_long local_30;
  unsigned_long local_28;
  unsigned_long local_20;
  statvfs *sfs_local;
  filesystem *fs_local;
  
  if (sfs->f_frsize == 0) {
    local_20 = 0xffffffffffffffff;
  }
  else {
    local_20 = sfs->f_frsize;
  }
  fs->xfer_align = local_20;
  fs->max_xfer_size = -1;
  if (sfs->f_bsize == 0) {
    local_28 = 0xffffffffffffffff;
  }
  else {
    local_28 = sfs->f_bsize;
  }
  fs->min_xfer_size = local_28;
  if (sfs->f_bsize == 0) {
    local_30 = 0xffffffffffffffff;
  }
  else {
    local_30 = sfs->f_bsize;
  }
  fs->incr_xfer_size = local_30;
  return;
}

Assistant:

static inline __LA_UNUSED void
set_statvfs_transfer_size(struct filesystem *fs, const struct statvfs *sfs)
{
	fs->xfer_align = sfs->f_frsize > 0 ? (long)sfs->f_frsize : -1;
	fs->max_xfer_size = -1;
#if defined(HAVE_STRUCT_STATVFS_F_IOSIZE)
	fs->min_xfer_size = sfs->f_iosize > 0 ? (long)sfs->f_iosize : -1;
	fs->incr_xfer_size = sfs->f_iosize > 0 ? (long)sfs->f_iosize : -1;
#else
	fs->min_xfer_size = sfs->f_bsize > 0 ? (long)sfs->f_bsize : -1;
	fs->incr_xfer_size = sfs->f_bsize > 0 ? (long)sfs->f_bsize : -1;
#endif
}